

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

QVariant * QAbstractSpinBoxPrivate::variantBound(QVariant *min,QVariant *value,QVariant *max)

{
  int iVar1;
  QVariant *in_RCX;
  QVariant *in_RDX;
  QVariant *in_RSI;
  QVariant *in_RDI;
  int compMax;
  QVariant *local_40;
  
  iVar1 = variantCompare(in_RSI,in_RDX);
  if (iVar1 < 0) {
    iVar1 = variantCompare(in_RSI,in_RDX);
    local_40 = in_RCX;
    if (iVar1 < 0) {
      local_40 = in_RDX;
    }
    ::QVariant::QVariant(in_RDI,(QVariant *)local_40);
  }
  else {
    ::QVariant::QVariant(in_RDI,(QVariant *)in_RSI);
  }
  return in_RDI;
}

Assistant:

QVariant QAbstractSpinBoxPrivate::variantBound(const QVariant &min,
                                               const QVariant &value,
                                               const QVariant &max)
{
    Q_ASSERT(variantCompare(min, max) <= 0);
    if (variantCompare(min, value) < 0) {
        const int compMax = variantCompare(value, max);
        return (compMax < 0 ? value : max);
    } else {
        return min;
    }
}